

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

int sexp_maybe_block_output_port(sexp ctx,sexp out)

{
  int iVar1;
  long in_RSI;
  int local_48;
  int local_40;
  int local_38;
  int local_30;
  long local_28;
  long local_20;
  
  if (*(long *)(in_RSI + 0x20) != 0) {
    if (*(long *)(in_RSI + 0x20) == 0) {
      if (((*(ulong *)(in_RSI + 0x18) & 3) == 0) && (**(int **)(in_RSI + 0x18) == 0x12)) {
        local_28 = *(long *)(*(long *)(in_RSI + 0x18) + 0x10);
      }
      else {
        local_28 = -1;
      }
      local_20 = local_28;
    }
    else {
      iVar1 = fileno(*(FILE **)(in_RSI + 0x20));
      local_20 = (long)iVar1;
    }
    if (-1 < local_20) {
      if (*(long *)(in_RSI + 0x48) == -1) {
        if (*(long *)(in_RSI + 0x20) == 0) {
          if (((*(ulong *)(in_RSI + 0x18) & 3) == 0) && (**(int **)(in_RSI + 0x18) == 0x12)) {
            local_38 = (int)*(undefined8 *)(*(long *)(in_RSI + 0x18) + 0x10);
          }
          else {
            local_38 = -1;
          }
          local_30 = local_38;
        }
        else {
          local_30 = fileno(*(FILE **)(in_RSI + 0x20));
        }
        iVar1 = fcntl(local_30,3);
        *(long *)(in_RSI + 0x48) = (long)iVar1;
      }
      if ((*(ulong *)(in_RSI + 0x48) & 0x800) != 0) {
        *(undefined1 *)(in_RSI + 0x36) = 1;
        if (*(long *)(in_RSI + 0x20) == 0) {
          if (((*(ulong *)(in_RSI + 0x18) & 3) == 0) && (**(int **)(in_RSI + 0x18) == 0x12)) {
            local_48 = (int)*(undefined8 *)(*(long *)(in_RSI + 0x18) + 0x10);
          }
          else {
            local_48 = -1;
          }
          local_40 = local_48;
        }
        else {
          local_40 = fileno(*(FILE **)(in_RSI + 0x20));
        }
        fcntl(local_40,4,*(ulong *)(in_RSI + 0x48) & 0xfffffffffffff7ff);
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int sexp_maybe_block_output_port (sexp ctx, sexp out) {
  if (sexp_port_stream(out) && sexp_port_fileno(out) >= 0) {
    if (sexp_port_flags(out) == SEXP_PORT_UNKNOWN_FLAGS)
      sexp_port_flags(out) = fcntl(sexp_port_fileno(out), F_GETFL);
    if (sexp_port_flags(out) & O_NONBLOCK) {
      sexp_port_blockedp(out) = 1;
      fcntl(sexp_port_fileno(out), F_SETFL, sexp_port_flags(out) & ~O_NONBLOCK);
      return 1;
    }
  }
  return 0;
}